

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O3

_Bool nni_id_visit(nni_id_map *m,uint64_t *keyp,void **valp,uint32_t *cursor)

{
  uint uVar1;
  void **ppvVar2;
  uint uVar3;
  ulong uVar4;
  void *pvVar5;
  _Bool _Var6;
  
  uVar1 = *cursor;
  uVar4 = (ulong)uVar1;
  uVar3 = m->id_cap;
  if (uVar1 < uVar3) {
    pvVar5 = m->id_entries[uVar4].val;
    _Var6 = true;
    if (pvVar5 == (void *)0x0) {
      ppvVar2 = &m->id_entries[uVar4 + 1].val;
      do {
        if ((ulong)uVar3 - 1 == uVar4) {
          _Var6 = false;
          goto LAB_00111180;
        }
        pvVar5 = *ppvVar2;
        ppvVar2 = ppvVar2 + 3;
        uVar4 = uVar4 + 1;
      } while (pvVar5 == (void *)0x0);
      _Var6 = uVar4 < uVar3;
    }
    if (valp != (void **)0x0) {
      *valp = pvVar5;
    }
    if (keyp != (uint64_t *)0x0) {
      *keyp = m->id_entries[uVar4].key;
    }
    uVar3 = (int)uVar4 + 1;
  }
  else {
    _Var6 = false;
    uVar3 = uVar1;
  }
LAB_00111180:
  *cursor = uVar3;
  return _Var6;
}

Assistant:

bool
nni_id_visit(nni_id_map *m, uint64_t *keyp, void **valp, uint32_t *cursor)
{
	// cursor is just a cursor into the table
	uint32_t index = *cursor;
	while (index < m->id_cap) {
		if (m->id_entries[index].val != NULL) {
			if (valp != NULL) {
				*valp = m->id_entries[index].val;
			}
			if (keyp != NULL) {
				*keyp = m->id_entries[index].key;
			}
			*cursor = index + 1;
			return true;
		}
		index++;
	}
	*cursor = index;
	return (false);
}